

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_ManAppendXorReal(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int iLit1_local;
  int iLit0_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManAppendObj(p);
  if (-1 < iLit0) {
    iVar1 = Abc_Lit2Var(iLit0);
    iVar2 = Gia_ManObjNum(p);
    if (iVar1 < iVar2) {
      if (-1 < iLit1) {
        iVar1 = Abc_Lit2Var(iLit1);
        iVar2 = Gia_ManObjNum(p);
        if (iVar1 < iVar2) {
          iVar1 = Abc_Lit2Var(iLit0);
          iVar2 = Abc_Lit2Var(iLit1);
          if (iVar1 == iVar2) {
            __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x2ae,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
          }
          iVar1 = Abc_LitIsCompl(iLit0);
          if (iVar1 == 0) {
            iVar1 = Abc_LitIsCompl(iLit1);
            if (iVar1 == 0) {
              iVar1 = Abc_Lit2Var(iLit0);
              iVar2 = Abc_Lit2Var(iLit1);
              if (iVar2 < iVar1) {
                iVar1 = Gia_ObjId(p,pObj_00);
                iVar2 = Abc_Lit2Var(iLit0);
                *(ulong *)pObj_00 =
                     *(ulong *)pObj_00 & 0xffffffffe0000000 |
                     (ulong)(uint)(iVar1 - iVar2) & 0x1fffffff;
                uVar3 = Abc_LitIsCompl(iLit0);
                *(ulong *)pObj_00 =
                     *(ulong *)pObj_00 & 0xffffffffdfffffff | ((ulong)uVar3 & 1) << 0x1d;
                iVar1 = Gia_ObjId(p,pObj_00);
                iVar2 = Abc_Lit2Var(iLit1);
                *(ulong *)pObj_00 =
                     *(ulong *)pObj_00 & 0xe0000000ffffffff |
                     ((ulong)(uint)(iVar1 - iVar2) & 0x1fffffff) << 0x20;
                uVar3 = Abc_LitIsCompl(iLit1);
                *(ulong *)pObj_00 =
                     *(ulong *)pObj_00 & 0xdfffffffffffffff | ((ulong)uVar3 & 1) << 0x3d;
              }
              else {
                iVar1 = Gia_ObjId(p,pObj_00);
                iVar2 = Abc_Lit2Var(iLit0);
                *(ulong *)pObj_00 =
                     *(ulong *)pObj_00 & 0xe0000000ffffffff |
                     ((ulong)(uint)(iVar1 - iVar2) & 0x1fffffff) << 0x20;
                uVar3 = Abc_LitIsCompl(iLit0);
                *(ulong *)pObj_00 =
                     *(ulong *)pObj_00 & 0xdfffffffffffffff | ((ulong)uVar3 & 1) << 0x3d;
                iVar1 = Gia_ObjId(p,pObj_00);
                iVar2 = Abc_Lit2Var(iLit1);
                *(ulong *)pObj_00 =
                     *(ulong *)pObj_00 & 0xffffffffe0000000 |
                     (ulong)(uint)(iVar1 - iVar2) & 0x1fffffff;
                uVar3 = Abc_LitIsCompl(iLit1);
                *(ulong *)pObj_00 =
                     *(ulong *)pObj_00 & 0xffffffffdfffffff | ((ulong)uVar3 & 1) << 0x1d;
              }
              p->nXors = p->nXors + 1;
              iVar1 = Gia_ObjId(p,pObj_00);
              return iVar1 << 1;
            }
            __assert_fail("!Abc_LitIsCompl(iLit1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x2b0,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
          }
          __assert_fail("!Abc_LitIsCompl(iLit0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x2af,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
        }
      }
      __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x2ad,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
    }
  }
  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x2ac,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
}

Assistant:

static inline int Gia_ManAppendXorReal( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p) );
    assert( Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1) );
    assert( !Abc_LitIsCompl(iLit0) );
    assert( !Abc_LitIsCompl(iLit1) );
    if ( Abc_Lit2Var(iLit0) > Abc_Lit2Var(iLit1) )
    {
        pObj->iDiff0  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0);
        pObj->fCompl0 = Abc_LitIsCompl(iLit0);
        pObj->iDiff1  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1);
        pObj->fCompl1 = Abc_LitIsCompl(iLit1);
    }
    else
    {
        pObj->iDiff1  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0);
        pObj->fCompl1 = Abc_LitIsCompl(iLit0);
        pObj->iDiff0  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1);
        pObj->fCompl0 = Abc_LitIsCompl(iLit1);
    }
    p->nXors++;
    return Gia_ObjId( p, pObj ) << 1;
}